

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

void display_bolt(game_event_type type,game_event_data *data,void *user)

{
  wchar_t local_44;
  uint8_t local_3d;
  wchar_t c;
  wchar_t wStack_38;
  uint8_t a;
  wchar_t x;
  wchar_t y;
  wchar_t ox;
  wchar_t oy;
  _Bool beam;
  _Bool seen;
  wchar_t wStack_24;
  _Bool drawing;
  wchar_t proj_type;
  wchar_t msec;
  void *user_local;
  game_event_data *data_local;
  game_event_type type_local;
  
  wStack_24 = (wchar_t)(player->opts).delay_factor;
  oy = (data->point).x;
  ox._3_1_ = (data->bolt).drawing & 1;
  ox._2_1_ = (data->bolt).seen & 1;
  ox._1_1_ = (data->bolt).beam & 1;
  y = (data->message).type;
  x = (data->bolt).ox;
  wStack_38 = (data->birthstage).n_choices;
  c = (data->birthstage).initial_choice;
  _proj_type = user;
  user_local = data;
  data_local._4_4_ = type;
  if (ox._2_1_ == 0) {
    if (ox._3_1_ != 0) {
      Term_xtra(L'\r',wStack_24);
    }
  }
  else {
    bolt_pict(y,x,wStack_38,c,oy,&local_3d,&local_44);
    print_rel(local_44,local_3d,wStack_38,c);
    move_cursor_relative(wStack_38,c);
    Term_fresh();
    if (player->upkeep->redraw != 0) {
      redraw_stuff(player);
    }
    Term_xtra(L'\r',wStack_24);
    event_signal_point(EVENT_MAP,c,wStack_38);
    Term_fresh();
    if (player->upkeep->redraw != 0) {
      redraw_stuff(player);
    }
    if ((ox._1_1_ & 1) != 0) {
      bolt_pict(wStack_38,c,wStack_38,c,oy,&local_3d,&local_44);
      print_rel(local_44,local_3d,wStack_38,c);
    }
  }
  return;
}

Assistant:

static void display_bolt(game_event_type type, game_event_data *data,
						 void *user)
{
	int msec = player->opts.delay_factor;
	int proj_type = data->bolt.proj_type;
	bool drawing = data->bolt.drawing;
	bool seen = data->bolt.seen;
	bool beam = data->bolt.beam;
	int oy = data->bolt.oy;
	int ox = data->bolt.ox;
	int y = data->bolt.y;
	int x = data->bolt.x;

	/* Only do visuals if the player can "see" the bolt */
	if (seen) {
		uint8_t a;
		wchar_t c;

		/* Obtain the bolt pict */
		bolt_pict(oy, ox, y, x, proj_type, &a, &c);

		/* Visual effects */
		print_rel(c, a, y, x);
		move_cursor_relative(y, x);
		Term_fresh();
		if (player->upkeep->redraw)
			redraw_stuff(player);
		Term_xtra(TERM_XTRA_DELAY, msec);
		event_signal_point(EVENT_MAP, x, y);
		Term_fresh();
		if (player->upkeep->redraw)
			redraw_stuff(player);

		/* Display "beam" grids */
		if (beam) {

			/* Obtain the explosion pict */
			bolt_pict(y, x, y, x, proj_type, &a, &c);

			/* Visual effects */
			print_rel(c, a, y, x);
		}
	} else if (drawing) {
		/* Delay for consistency */
		Term_xtra(TERM_XTRA_DELAY, msec);
	}
}